

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void * WindowSettingsHandler_ReadOpen
                 (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  ImU32 id;
  ImGuiWindowSettings *pIVar1;
  
  id = ImHashStr(name,0,0);
  pIVar1 = ImGui::FindWindowSettings(id);
  if (pIVar1 != (ImGuiWindowSettings *)0x0) {
    return pIVar1;
  }
  pIVar1 = ImGui::CreateNewWindowSettings(name);
  return pIVar1;
}

Assistant:

static void* WindowSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiWindowSettings* settings = ImGui::FindWindowSettings(ImHashStr(name));
    if (!settings)
        settings = ImGui::CreateNewWindowSettings(name);
    return (void*)settings;
}